

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O3

void * integrate_thread(void *arg)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  void *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *extraout_RAX_00;
  void *extraout_RAX_01;
  ulong uVar5;
  int iVar6;
  int iVar7;
  double *in_RSI;
  long lVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double dVar12;
  double dVar13;
  undefined8 uStack_d8;
  ulong uStack_d0;
  double dStack_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vStack_c0;
  vector<Argument,_std::allocator<Argument>_> vStack_a8;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  void *pvStack_68;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  void *pvVar4;
  
  lVar8 = *(long *)((long)arg + 0x28);
  local_30 = *(double *)((long)arg + 0x10);
  if (*(long *)(lVar8 + 0x10) == 0) {
LAB_001026ee:
    dVar12 = (double)std::__throw_bad_function_call();
    iVar7 = (int)in_RSI;
    dStack_c8 = in_XMM2_Qa;
    pvStack_68 = arg;
    std::vector<Argument,_std::allocator<Argument>_>::vector
              (&vStack_a8,(long)iVar7,(allocator_type *)&uStack_90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&vStack_c0,(long)iVar7,(allocator_type *)&uStack_90);
    iVar6 = 0;
    uStack_70 = 0;
    uStack_80 = 0;
    uStack_78 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    uStack_d8 = 0;
    pvVar4 = extraout_RAX;
    if (0 < iVar7) {
      dVar11 = dVar12;
      if (dVar12 <= in_XMM1_Qa) {
        dVar11 = in_XMM1_Qa;
        in_XMM1_Qa = dVar12;
      }
      dVar12 = (dVar11 - in_XMM1_Qa) / (double)iVar7;
      uStack_d0 = (ulong)in_RSI & 0xffffffff;
      lVar1 = uStack_d0 * 8;
      lVar10 = 0x28;
      lVar9 = 0;
      do {
        dVar11 = (double)iVar6;
        iVar6 = iVar6 + 1;
        *(undefined8 **)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 + -0x28) = &uStack_90;
        *(undefined8 **)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 + -0x20) = &uStack_d8;
        *(double *)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 + -0x18) = dVar11 * dVar12 + in_XMM1_Qa;
        *(double *)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 + -0x10) =
             (double)iVar6 * dVar12 + in_XMM1_Qa;
        *(double *)
         ((long)vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                super__Vector_impl_data._M_start + lVar10 + -8) = dStack_c8;
        *(long *)((long)&(vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                          super__Vector_impl_data._M_start)->mutex + lVar10) = lVar8;
        iVar3 = pthread_create((pthread_t *)
                               ((long)vStack_c0.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar9),
                               (pthread_attr_t *)0x0,integrate_thread,
                               (void *)((long)vStack_a8.
                                              super__Vector_base<Argument,_std::allocator<Argument>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                       lVar10 + -0x28));
        uVar2 = uStack_d0;
        pvVar4 = (void *)CONCAT44(extraout_var,iVar3);
        lVar10 = lVar10 + 0x30;
        lVar9 = lVar9 + 8;
      } while (lVar1 - lVar9 != 0);
      if (0 < iVar7) {
        uVar5 = 0;
        do {
          iVar6 = pthread_join(vStack_c0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar5],(void **)0x0);
          pvVar4 = (void *)CONCAT44(extraout_var_00,iVar6);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
    }
    if (vStack_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_c0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      pvVar4 = extraout_RAX_00;
    }
    if (vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(vStack_a8.super__Vector_base<Argument,_std::allocator<Argument>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pvVar4 = extraout_RAX_01;
    }
    return pvVar4;
  }
  in_RSI = &local_30;
  dVar11 = (double)(**(code **)(lVar8 + 0x18))();
  dVar12 = *(double *)((long)arg + 0x18);
  in_XMM1_Qa = *(double *)((long)arg + 0x20);
  dVar13 = 0.0;
  if (*(double *)((long)arg + 0x10) < in_XMM1_Qa * -0.5 + dVar12) {
    local_20 = *(double *)((long)arg + 0x10);
    do {
      local_18 = dVar11;
      local_28 = dVar12 - local_20;
      if (in_XMM1_Qa <= dVar12 - local_20) {
        local_28 = in_XMM1_Qa;
      }
      in_XMM2_Qa = local_20 + local_28;
      lVar8 = *(long *)((long)arg + 0x28);
      local_30 = in_XMM2_Qa;
      local_20 = in_XMM2_Qa;
      if (*(long *)(lVar8 + 0x10) == 0) goto LAB_001026ee;
      in_RSI = &local_30;
      dVar11 = (double)(**(code **)(lVar8 + 0x18))();
      dVar13 = dVar13 + local_28 * (local_18 + dVar11) * 0.5;
      dVar12 = *(double *)((long)arg + 0x18);
      in_XMM1_Qa = *(double *)((long)arg + 0x20);
    } while (local_20 < dVar12 - in_XMM1_Qa * 0.5);
  }
  pthread_mutex_lock(*arg);
  **(double **)((long)arg + 8) = dVar13 + **(double **)((long)arg + 8);
  pthread_mutex_unlock(*arg);
  return (void *)0x0;
}

Assistant:

void * integrate_thread(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  double func = (*(p -> func))(p -> a), new_funk, t = p -> a;
  double res  = 0;
  while(t < p -> b - p-> h/2){
    auto h = std::min(p -> h, p -> b - t);
    t += h;
    new_funk = (*(p -> func))(t);
    res +=  (new_funk + func) * h / 2;
    func = new_funk;
  }
  pthread_mutex_lock(p->mutex);
  *(p -> result) += res;
  pthread_mutex_unlock(p->mutex);
  return nullptr;
}